

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O1

void __thiscall
OpenMPVariantClause::setArchExpression
          (OpenMPVariantClause *this,char *_score,char *_arch_expression)

{
  allocator<char> local_b2;
  allocator<char> local_b1;
  long *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  long *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,_score,&local_b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,_arch_expression,&local_b2)
  ;
  if (local_b0 == (long *)&local_a0) {
    uStack_58 = uStack_98;
    local_70 = &local_60;
  }
  else {
    local_70 = local_b0;
  }
  local_60 = CONCAT71(uStack_9f,local_a0);
  local_68 = local_a8;
  local_a8 = 0;
  local_a0 = 0;
  if (local_90 == (long *)&local_80) {
    uStack_38 = uStack_78;
    local_50 = &local_40;
  }
  else {
    local_50 = local_90;
  }
  local_40 = CONCAT71(uStack_7f,local_80);
  local_48 = local_88;
  local_88 = 0;
  local_80 = 0;
  local_b0 = (long *)&local_a0;
  local_90 = (long *)&local_80;
  std::__cxx11::string::operator=((string *)&this->arch_expression,(string *)&local_70);
  std::__cxx11::string::operator=((string *)&(this->arch_expression).second,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != (long *)&local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_b0 != (long *)&local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

std::vector<std::pair<std::string, OpenMPDirective*> >* getConstructDirective() { return &construct_directives; }